

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleMenuItem::childAt(QAccessibleMenuItem *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  QAccessibleInterface *pQVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**(code **)(*(long *)this + 0x50))();
  do {
    if (iVar2 < 1) {
      pQVar3 = (QAccessibleInterface *)0x0;
      break;
    }
    iVar2 = iVar2 + -1;
    pQVar3 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x48))(this,iVar2);
    QVar4 = (QRect)(**(code **)(*(long *)pQVar3 + 0x70))(pQVar3);
    local_48 = QVar4;
    bVar1 = QRect::contains(&local_48,x,y);
  } while (!bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QAccessibleInterface *QAccessibleMenuItem::childAt(int x, int y ) const
{
    for (int i = childCount() - 1; i >= 0; --i) {
        QAccessibleInterface *childInterface = child(i);
        if (childInterface->rect().contains(x,y)) {
            return childInterface;
        }
    }
    return nullptr;
}